

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cs_active.cc
# Opt level: O3

void predict_or_learn<true,true>(cs_active *cs_a,single_learner *base,example *ec)

{
  v_array<lq_data> *this;
  unsigned_long *puVar1;
  uint64_t *puVar2;
  float fVar3;
  uint uVar4;
  wclass *pwVar5;
  wclass *pwVar6;
  vw *pvVar7;
  shared_data *psVar8;
  wclass *pwVar9;
  size_t sVar10;
  ostream *poVar11;
  long *plVar12;
  size_t sVar13;
  ulong uVar14;
  int iVar15;
  wclass *__begin2;
  wclass *pwVar16;
  uint uVar17;
  lq_data *plVar18;
  uint uVar19;
  lq_data *lqd;
  ulong uVar20;
  lq_data *max_pred;
  char cVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  v_array<lq_data> *__range2;
  stringstream filename;
  float local_268;
  size_t local_230;
  string local_1d8;
  undefined1 local_1b8 [128];
  ios_base local_138 [264];
  
  pwVar5 = (ec->l).cs.costs._begin;
  pwVar6 = (ec->l).cs.costs._end;
  pwVar9 = (ec->l).cs.costs.end_array;
  sVar10 = (ec->l).cs.costs.erase_count;
  uVar20 = cs_a->all->sd->queries;
  uVar14 = (ulong)cs_a->num_classes;
  if (cs_a->min_labels * uVar14 <= uVar20) {
    std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
    poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)(local_1b8 + 0x10),
                         (cs_a->all->final_regressor_name)._M_dataplus._M_p,
                         (cs_a->all->final_regressor_name)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar11,".",1);
    poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)poVar11);
    std::__ostream_insert<char,std::char_traits<char>>(poVar11,".",1);
    poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)poVar11);
    std::__ostream_insert<char,std::char_traits<char>>(poVar11,".",1);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar11);
    pvVar7 = cs_a->all;
    std::__cxx11::stringbuf::str();
    VW::save_predictor(pvVar7,&local_1d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
      operator_delete(local_1d8._M_dataplus._M_p);
    }
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '(');
    std::ostream::put('(');
    poVar11 = (ostream *)std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar11,"Number of examples with at least one query = ",0x2d);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar11);
    cs_a->min_labels = cs_a->min_labels << 1;
    if ((cs_a->examples_by_queries)._end != (cs_a->examples_by_queries)._begin) {
      uVar20 = 0;
      do {
        std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '(');
        std::ostream::put('(');
        poVar11 = (ostream *)std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>(poVar11,"examples with ",0xe);
        poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)poVar11);
        std::__ostream_insert<char,std::char_traits<char>>(poVar11," labels queried = ",0x12);
        std::ostream::_M_insert<unsigned_long>((ulong)poVar11);
        uVar20 = uVar20 + 1;
      } while (uVar20 < (ulong)((long)(cs_a->examples_by_queries)._end -
                                (long)(cs_a->examples_by_queries)._begin >> 3));
    }
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '(');
    std::ostream::put('(');
    poVar11 = (ostream *)std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar11,"labels outside of cost range = ",0x1f);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar11);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '(');
    std::ostream::put('(');
    poVar11 = (ostream *)std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>(poVar11,"average distance to range = ",0x1c);
    std::ostream::_M_insert<double>
              ((double)(cs_a->distance_to_range / (float)cs_a->labels_outside_range));
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '(');
    std::ostream::put('(');
    poVar11 = (ostream *)std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>(poVar11,"average range = ",0x10);
    std::ostream::_M_insert<double>((double)(cs_a->range / (float)cs_a->labels_outside_range));
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '(');
    std::ostream::put('(');
    plVar12 = (long *)std::ostream::flush();
    std::ios::widen((char)*(undefined8 *)(*plVar12 + -0x18) + (char)plVar12);
    std::ostream::put((char)plVar12);
    std::ostream::flush();
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
    std::ios_base::~ios_base(local_138);
    uVar20 = cs_a->all->sd->queries;
    uVar14 = (ulong)cs_a->num_classes;
  }
  if (uVar14 * cs_a->max_labels <= uVar20) {
    return;
  }
  (ec->l).cs.costs._begin = (wclass *)0x0;
  (ec->l).simple.initial = 0.0;
  uVar20 = cs_a->t;
  fVar23 = (float)uVar20 + -1.0;
  fVar24 = cs_a->cost_max;
  fVar26 = cs_a->cost_min;
  fVar25 = cs_a->c1;
  fVar3 = cs_a->c0;
  fVar22 = 1.0;
  if (1.0 <= fVar23) {
    fVar22 = fVar23;
  }
  fVar22 = logf(fVar22 * (float)cs_a->num_classes);
  if (pwVar6 == pwVar5) {
    if (cs_a->num_classes == 0) {
      uVar17 = 1;
    }
    else {
      fVar24 = 3.4028235e+38;
      uVar19 = 1;
      uVar17 = 1;
      do {
        puVar2 = &(ec->super_example_predict).ft_offset;
        *puVar2 = *puVar2 + (ulong)(*(int *)(base + 0xe0) * (uVar19 - 1));
        (**(code **)(base + 0x30))(*(undefined8 *)(base + 0x18),*(undefined8 *)(base + 0x20),ec);
        puVar2 = &(ec->super_example_predict).ft_offset;
        *puVar2 = *puVar2 - (ulong)((uVar19 - 1) * *(int *)(base + 0xe0));
        fVar26 = ec->partial_prediction;
        if ((fVar26 < fVar24) || (uVar19 < uVar17 && fVar26 == fVar24)) {
          fVar24 = fVar26;
          uVar17 = uVar19;
        }
        if (ec->passthrough != (features *)0x0) {
          features::push_back(ec->passthrough,fVar26,(ulong)uVar19 ^ 0x398d9fda640553);
        }
        uVar19 = uVar19 + 1;
      } while (uVar19 <= cs_a->num_classes);
    }
    goto LAB_001e2de4;
  }
  fVar23 = cs_a->cost_max - cs_a->cost_min;
  fVar3 = fVar23 * fVar23 * fVar3 * fVar22;
  this = &cs_a->query_data;
  pwVar16 = pwVar5;
  do {
    local_1b8._0_7_ = 0;
    local_1b8._7_4_ = 0;
    local_1b8._16_8_ = pwVar16;
    v_array<lq_data>::push_back(this,(lq_data *)local_1b8);
    pwVar16 = pwVar16 + 1;
  } while (pwVar16 != pwVar6);
  max_pred = (cs_a->query_data)._begin;
  plVar18 = (cs_a->query_data)._end;
  if (max_pred == plVar18) {
    local_230 = cs_a->all->sd->queries;
LAB_001e2d70:
    uVar17 = 1;
    local_268 = 3.4028235e+38;
  }
  else {
    fVar22 = 3.4028235e+38;
    do {
      find_cost_range(cs_a,base,ec,max_pred->cl->class_index,fVar3,
                      ((fVar24 - fVar26) * fVar25) / SQRT((float)uVar20),&max_pred->min_pred,
                      &max_pred->max_pred,&max_pred->is_range_large);
      fVar23 = max_pred->max_pred;
      if (fVar22 <= max_pred->max_pred) {
        fVar23 = fVar22;
      }
      max_pred = max_pred + 1;
      fVar22 = fVar23;
    } while (max_pred != plVar18);
    max_pred = (cs_a->query_data)._begin;
    plVar18 = (cs_a->query_data)._end;
    uVar19 = 0;
    if (max_pred != plVar18) {
      do {
        fVar24 = max_pred->min_pred;
        max_pred->is_range_overlapped = fVar23 >= fVar24;
        if (fVar23 < fVar24) {
          uVar20 = 0;
        }
        else {
          uVar20 = (ulong)max_pred->is_range_large ^ 1;
        }
        cs_a->overlapped_and_range_small = cs_a->overlapped_and_range_small + uVar20;
        fVar26 = max_pred->cl->x;
        if ((max_pred->max_pred <= fVar26 && fVar26 != max_pred->max_pred) ||
           (fVar26 < max_pred->min_pred)) {
          cs_a->labels_outside_range = cs_a->labels_outside_range + 1;
          fVar26 = max_pred->cl->x;
          fVar25 = fVar26 - max_pred->max_pred;
          fVar26 = max_pred->min_pred - fVar26;
          if (fVar26 <= fVar25) {
            fVar26 = fVar25;
          }
          cs_a->distance_to_range = fVar26 + cs_a->distance_to_range;
          cs_a->range = (max_pred->max_pred - max_pred->min_pred) + cs_a->range;
        }
        uVar19 = uVar19 + (fVar24 <= fVar23);
        max_pred = max_pred + 1;
      } while (max_pred != plVar18);
      max_pred = (cs_a->query_data)._begin;
      plVar18 = (cs_a->query_data)._end;
    }
    local_230 = cs_a->all->sd->queries;
    if (max_pred == plVar18) goto LAB_001e2d70;
    uVar17 = 1;
    local_268 = 3.4028235e+38;
    do {
      if (uVar19 < 2) {
        if (cs_a->use_domination == false) {
LAB_001e28b2:
          cVar21 = max_pred->is_range_large;
        }
        else {
LAB_001e288e:
          cVar21 = '\0';
        }
      }
      else {
        cVar21 = '\x01';
        if ((cs_a->is_baseline == false) &&
           ((cs_a->use_domination != false || (max_pred->is_range_large == false)))) {
          if (max_pred->is_range_overlapped == true) goto LAB_001e28b2;
          goto LAB_001e288e;
        }
      }
      pwVar16 = max_pred->cl;
      uVar4 = pwVar16->class_index;
      fVar24 = pwVar16->x;
      iVar15 = uVar4 - 1;
      puVar2 = &(ec->super_example_predict).ft_offset;
      *puVar2 = *puVar2 + (ulong)(uint)(*(int *)(base + 0xe0) * iVar15);
      (**(code **)(base + 0x30))(*(undefined8 *)(base + 0x18),*(undefined8 *)(base + 0x20),ec);
      puVar2 = &(ec->super_example_predict).ft_offset;
      *puVar2 = *puVar2 - (ulong)(uint)(*(int *)(base + 0xe0) * iVar15);
      pvVar7 = cs_a->all;
      (ec->l).simple.weight = 1.0;
      ec->weight = 1.0;
      if (cVar21 == '\0') {
        (ec->l).multi.label = 0x7f7fffff;
      }
      else {
        (ec->l).simple.label = fVar24;
        psVar8 = pvVar7->sd;
        psVar8->queries = psVar8->queries + 1;
        fVar24 = (ec->l).simple.label;
        if ((fVar24 != 3.4028235e+38) || (NAN(fVar24))) {
          puVar2 = &(ec->super_example_predict).ft_offset;
          *puVar2 = *puVar2 + (ulong)(uint)(*(int *)(base + 0xe0) * iVar15);
          (**(code **)(base + 0x28))(*(undefined8 *)(base + 0x18),*(undefined8 *)(base + 0x20),ec);
          puVar2 = &(ec->super_example_predict).ft_offset;
          *puVar2 = *puVar2 - (ulong)(uint)(iVar15 * *(int *)(base + 0xe0));
        }
      }
      fVar24 = ec->partial_prediction;
      pwVar16->partial_prediction = fVar24;
      if (fVar24 < local_268) {
LAB_001e29d8:
        uVar17 = uVar4;
        local_268 = fVar24;
      }
      else if (((fVar24 == local_268) && (!NAN(fVar24) && !NAN(local_268))) && (uVar4 < uVar17))
      goto LAB_001e29d8;
      if (ec->passthrough != (features *)0x0) {
        features::push_back(ec->passthrough,fVar24,(ulong)uVar4 ^ 0x398d9fda640553);
      }
      if (max_pred->query_needed == true) {
        v_array<unsigned_int>::push_back
                  ((v_array<unsigned_int> *)&(ec->pred).scalars,&max_pred->cl->class_index);
      }
      if (cs_a->print_debug_stuff == true) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"label=",6);
        poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
        std::__ostream_insert<char,std::char_traits<char>>(poVar11," x=",3);
        poVar11 = std::ostream::_M_insert<double>((double)max_pred->cl->x);
        std::__ostream_insert<char,std::char_traits<char>>(poVar11," prediction=",0xc);
        poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)poVar11);
        std::__ostream_insert<char,std::char_traits<char>>(poVar11," score=",7);
        poVar11 = std::ostream::_M_insert<double>((double)local_268);
        std::__ostream_insert<char,std::char_traits<char>>(poVar11," pp=",4);
        poVar11 = std::ostream::_M_insert<double>((double)max_pred->cl->partial_prediction);
        std::__ostream_insert<char,std::char_traits<char>>(poVar11," ql=",4);
        poVar11 = std::ostream::_M_insert<bool>(SUB81(poVar11,0));
        std::__ostream_insert<char,std::char_traits<char>>(poVar11," qn=",4);
        poVar11 = std::ostream::_M_insert<bool>(SUB81(poVar11,0));
        std::__ostream_insert<char,std::char_traits<char>>(poVar11," ro=",4);
        poVar11 = std::ostream::_M_insert<bool>(SUB81(poVar11,0));
        std::__ostream_insert<char,std::char_traits<char>>(poVar11," rl=",4);
        poVar11 = std::ostream::_M_insert<bool>(SUB81(poVar11,0));
        std::__ostream_insert<char,std::char_traits<char>>(poVar11," [",2);
        poVar11 = std::ostream::_M_insert<double>((double)max_pred->min_pred);
        std::__ostream_insert<char,std::char_traits<char>>(poVar11,", ",2);
        poVar11 = std::ostream::_M_insert<double>((double)max_pred->max_pred);
        std::__ostream_insert<char,std::char_traits<char>>(poVar11,"] vs delta=",0xb);
        poVar11 = std::ostream::_M_insert<double>((double)fVar3);
        std::__ostream_insert<char,std::char_traits<char>>(poVar11," n_overlapped=",0xe);
        poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)poVar11);
        std::__ostream_insert<char,std::char_traits<char>>(poVar11," is_baseline=",0xd);
        poVar11 = std::ostream::_M_insert<bool>(SUB81(poVar11,0));
        std::ios::widen((char)poVar11->_vptr_basic_ostream[-3] + (char)poVar11);
        std::ostream::put((char)poVar11);
        std::ostream::flush();
      }
      max_pred = max_pred + 1;
    } while (max_pred != plVar18);
    max_pred = this->_begin;
  }
  if (max_pred != (lq_data *)0x0) {
    free(max_pred);
  }
  this->_begin = (lq_data *)0x0;
  (cs_a->query_data)._end = (lq_data *)0x0;
  (cs_a->query_data).end_array = (lq_data *)0x0;
  sVar13 = local_230;
  if (cs_a->all->sd->queries != local_230) {
    cs_a->num_any_queries = cs_a->num_any_queries + 1;
    sVar13 = cs_a->all->sd->queries;
  }
  puVar1 = (cs_a->examples_by_queries)._begin + (sVar13 - local_230);
  *puVar1 = *puVar1 + 1;
  ec->partial_prediction = local_268;
  cs_a->t = cs_a->t + 1;
LAB_001e2de4:
  (ec->pred).multiclass = uVar17;
  (ec->l).cs.costs._begin = pwVar5;
  (ec->l).cs.costs._end = pwVar6;
  (ec->l).cs.costs.end_array = pwVar9;
  (ec->l).cs.costs.erase_count = sVar10;
  return;
}

Assistant:

void predict_or_learn(cs_active& cs_a, single_learner& base, example& ec)
{
  // cerr << "------------- passthrough" << endl;
  COST_SENSITIVE::label ld = ec.l.cs;

  // cerr << "is_learn=" << is_learn << " ld.costs.size()=" << ld.costs.size() << endl;
  if (cs_a.all->sd->queries >= cs_a.min_labels * cs_a.num_classes)
  {
    // save regressor
    stringstream filename;
    filename << cs_a.all->final_regressor_name << "." << ec.example_counter << "." << cs_a.all->sd->queries << "."
             << cs_a.num_any_queries;
    VW::save_predictor(*(cs_a.all), filename.str());
    cerr << endl << "Number of examples with at least one query = " << cs_a.num_any_queries;
    // Double label query budget
    cs_a.min_labels *= 2;
    for (size_t i = 0; i < cs_a.examples_by_queries.size(); i++)
    {
      cerr << endl << "examples with " << i << " labels queried = " << cs_a.examples_by_queries[i];
    }

    cerr << endl << "labels outside of cost range = " << cs_a.labels_outside_range;
    cerr << endl << "average distance to range = " << cs_a.distance_to_range / ((float)cs_a.labels_outside_range);
    cerr << endl << "average range = " << cs_a.range / ((float)cs_a.labels_outside_range);

    /*
    for (size_t i=0; i<cs_a.all->sd->distance_to_range.size(); i++)
    {  cerr << endl << "label " << i << ", average distance to range = " <<
    cs_a.all->sd->distance_to_range[i]/((float)(cs_a.t-1));
    }*/

    cerr << endl << endl;
  }

  if (cs_a.all->sd->queries >= cs_a.max_labels * cs_a.num_classes)
    return;

  uint32_t prediction = 1;
  float score = FLT_MAX;
  ec.l.simple = {0., 0., 0.};

  float min_max_cost = FLT_MAX;
  float t = (float)cs_a.t;  // ec.example_t;  // current round
  float t_prev = t - 1.f;   // ec.weight; // last round

  float eta = cs_a.c1 * (cs_a.cost_max - cs_a.cost_min) / sqrt(t);  // threshold on cost range
  float delta = cs_a.c0 * log((float)(cs_a.num_classes * max(t_prev, 1.f))) *
      pow(cs_a.cost_max - cs_a.cost_min, 2);  // threshold on empirical loss difference

  if (ld.costs.size() > 0)
  {
    // Create metadata structure
    for (COST_SENSITIVE::wclass& cl : ld.costs)
    {
      lq_data f = {0.0, 0.0, 0, 0, 0, cl};
      cs_a.query_data.push_back(f);
    }
    uint32_t n_overlapped = 0;
    for (lq_data& lqd : cs_a.query_data)
    {
      find_cost_range(cs_a, base, ec, lqd.cl.class_index, delta, eta, lqd.min_pred, lqd.max_pred, lqd.is_range_large);
      min_max_cost = min(min_max_cost, lqd.max_pred);
    }
    for (lq_data& lqd : cs_a.query_data)
    {
      lqd.is_range_overlapped = (lqd.min_pred <= min_max_cost);
      n_overlapped += (uint32_t)(lqd.is_range_overlapped);
      // large_range = large_range || (cl.is_range_overlapped && cl.is_range_large);
      // if(cl.is_range_overlapped && is_learn)
      //{ cout << "label " << cl.class_index << ", min_pred = " << cl.min_pred << ", max_pred = " << cl.max_pred << ",
      // is_range_large = " << cl.is_range_large << ", eta = " << eta << ", min_max_cost = " << min_max_cost << endl;
      //}
      cs_a.overlapped_and_range_small += (size_t)(lqd.is_range_overlapped && !lqd.is_range_large);
      if (lqd.cl.x > lqd.max_pred || lqd.cl.x < lqd.min_pred)
      {
        cs_a.labels_outside_range++;
        // cs_a.all->sd->distance_to_range[cl.class_index-1] += max(cl.x - cl.max_pred, cl.min_pred - cl.x);
        cs_a.distance_to_range += max(lqd.cl.x - lqd.max_pred, lqd.min_pred - lqd.cl.x);
        cs_a.range += lqd.max_pred - lqd.min_pred;
      }
    }

    bool query = (n_overlapped > 1);
    size_t queries = cs_a.all->sd->queries;
    // bool any_query = false;
    for (lq_data& lqd : cs_a.query_data)
    {
      bool query_label = ((query && cs_a.is_baseline) || (!cs_a.use_domination && lqd.is_range_large) ||
          (query && lqd.is_range_overlapped && lqd.is_range_large));
      inner_loop<is_learn, is_simulation>(cs_a, base, ec, lqd.cl.class_index, lqd.cl.x, prediction, score,
          lqd.cl.partial_prediction, query_label, lqd.query_needed);
      if (lqd.query_needed)
        ec.pred.multilabels.label_v.push_back(lqd.cl.class_index);
      if (cs_a.print_debug_stuff)
        cerr << "label=" << lqd.cl.class_index << " x=" << lqd.cl.x << " prediction=" << prediction
             << " score=" << score << " pp=" << lqd.cl.partial_prediction << " ql=" << query_label
             << " qn=" << lqd.query_needed << " ro=" << lqd.is_range_overlapped << " rl=" << lqd.is_range_large << " ["
             << lqd.min_pred << ", " << lqd.max_pred << "] vs delta=" << delta << " n_overlapped=" << n_overlapped
             << " is_baseline=" << cs_a.is_baseline << endl;
    }

    // Need to pop metadata
    cs_a.query_data.delete_v();

    if (cs_a.all->sd->queries - queries > 0)
      cs_a.num_any_queries++;

    cs_a.examples_by_queries[cs_a.all->sd->queries - queries] += 1;
    // if(any_query)
    // cs_a.num_any_queries++;

    ec.partial_prediction = score;
    if (is_learn)
    {
      cs_a.t++;
    }
  }
  else
  {
    float temp = 0.f;
    bool temp2 = false, temp3 = false;
    for (uint32_t i = 1; i <= cs_a.num_classes; i++)
    {
      inner_loop<false, is_simulation>(cs_a, base, ec, i, FLT_MAX, prediction, score, temp, temp2, temp3);
    }
  }

  ec.pred.multiclass = prediction;
  ec.l.cs = ld;
}